

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

bool __thiscall
crnlib::dxt1_endpoint_optimizer::evaluate_solution
          (dxt1_endpoint_optimizer *this,dxt1_solution_coordinates *coords,bool alternate_rounding)

{
  anon_struct_16_2_20c1c745 *paVar1;
  anon_struct_16_2_20c1c745 *paVar2;
  anon_struct_16_2_20c1c745 *paVar3;
  anon_struct_16_2_20c1c745 *paVar4;
  anon_struct_16_2_20c1c745 *paVar5;
  anon_struct_16_2_20c1c745 *paVar6;
  bool bVar7;
  color_quad_u8 c1;
  color_quad_u8 c0;
  insert_result solution_res;
  empty_type local_55;
  dxt1_solution_coordinates local_54;
  undefined1 local_50 [5];
  byte local_4b;
  byte local_4a;
  insert_result local_48;
  
  bVar7 = false;
  dxt1_block::unpack_color((dxt1_block *)(local_50 + 4),coords->m_low_color,false,0xff);
  dxt1_block::unpack_color((dxt1_block *)local_50,coords->m_high_color,false,0xff);
  paVar1 = (anon_struct_16_2_20c1c745 *)&this->m_rDist[0].high;
  if (local_50[0] <= local_50[4]) {
    paVar1 = this->m_rDist;
  }
  paVar2 = (anon_struct_16_2_20c1c745 *)&this->m_rDist[0].high;
  if (local_50[0] > local_50[4]) {
    paVar2 = this->m_rDist;
  }
  paVar3 = (anon_struct_16_2_20c1c745 *)&this->m_gDist[0].high;
  if (local_50[1] <= local_4b) {
    paVar3 = this->m_gDist;
  }
  paVar4 = (anon_struct_16_2_20c1c745 *)&this->m_gDist[0].high;
  if (local_50[1] > local_4b) {
    paVar4 = this->m_gDist;
  }
  paVar5 = (anon_struct_16_2_20c1c745 *)&this->m_bDist[0].high;
  if (local_50[2] <= local_4a) {
    paVar5 = this->m_bDist;
  }
  paVar6 = (anon_struct_16_2_20c1c745 *)&this->m_bDist[0].high;
  if (local_50[2] > local_4a) {
    paVar6 = this->m_bDist;
  }
  if (paVar3[local_50[1]].low + paVar4[local_4b].low +
      paVar1[local_50[0]].low + paVar2[local_50[4]].low +
      paVar5[local_50[2]].low + paVar6[local_4a].low < (this->m_best_solution).m_error) {
    if (!alternate_rounding) {
      local_54 = *coords;
      hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
      ::insert(&local_48,&this->m_solutions_tried,(uint *)&local_54,&local_55);
      if (local_48.second != true) {
        return false;
      }
    }
    if (this->m_evaluate_hc == true) {
      if (this->m_perceptual == true) {
        bVar7 = evaluate_solution_hc_perceptual(this,coords,alternate_rounding);
      }
      else {
        bVar7 = evaluate_solution_hc_uniform(this,coords,alternate_rounding);
      }
    }
    else if (this->m_pParams->m_quality < cCRNDXTQualityBetter) {
      bVar7 = evaluate_solution_fast(this,coords,alternate_rounding);
    }
    else {
      bVar7 = evaluate_solution_uber(this,coords,alternate_rounding);
    }
  }
  return bVar7;
}

Assistant:

bool dxt1_endpoint_optimizer::evaluate_solution(const dxt1_solution_coordinates& coords, bool alternate_rounding)
    {
        color_quad_u8 c0 = dxt1_block::unpack_color(coords.m_low_color, false);
        color_quad_u8 c1 = dxt1_block::unpack_color(coords.m_high_color, false);
        uint64 rError = c0.r < c1.r ? m_rDist[c0.r].low + m_rDist[c1.r].high : m_rDist[c0.r].high + m_rDist[c1.r].low;
        uint64 gError = c0.g < c1.g ? m_gDist[c0.g].low + m_gDist[c1.g].high : m_gDist[c0.g].high + m_gDist[c1.g].low;
        uint64 bError = c0.b < c1.b ? m_bDist[c0.b].low + m_bDist[c1.b].high : m_bDist[c0.b].high + m_bDist[c1.b].low;
        if (rError + gError + bError >= m_best_solution.m_error)
        {
            return false;
        }
        if (!alternate_rounding)
        {
            solution_hash_map::insert_result solution_res(m_solutions_tried.insert(coords.m_low_color | coords.m_high_color << 16));
            if (!solution_res.second)
            {
                return false;
            }
        }
        if (m_evaluate_hc)
        {
            return m_perceptual ? evaluate_solution_hc_perceptual(coords, alternate_rounding) : evaluate_solution_hc_uniform(coords, alternate_rounding);
        }
        if (m_pParams->m_quality >= cCRNDXTQualityBetter)
        {
            return evaluate_solution_uber(coords, alternate_rounding);
        }
        return evaluate_solution_fast(coords, alternate_rounding);
    }